

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

string * cmsys::SystemTools::GetFilenamePath(string *__return_storage_ptr__,string *filename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long lVar3;
  string local_38;
  
  paVar1 = &local_38.field_2;
  pcVar2 = (filename->_M_dataplus)._M_p;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar2,pcVar2 + filename->_M_string_length);
  ConvertToUnixSlashes(&local_38);
  lVar3 = std::__cxx11::string::rfind((char)&local_38,0x2f);
  if (lVar3 == -1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    goto LAB_0012d501;
  }
  if (lVar3 == 2) {
    if (local_38._M_dataplus._M_p[1] != ':') goto LAB_0012d499;
    std::__cxx11::string::resize((ulong)&local_38,'\x03');
  }
  else {
    if (lVar3 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"/","");
      goto LAB_0012d501;
    }
LAB_0012d499:
    std::__cxx11::string::resize((ulong)&local_38,(char)lVar3);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p == paVar1) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,local_38.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_38.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_38._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,local_38.field_2._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = local_38._M_string_length;
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  local_38._M_dataplus._M_p = (pointer)paVar1;
LAB_0012d501:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,
                    CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,
                             local_38.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SystemTools::GetFilenamePath(const std::string& filename)
{
  std::string fn = filename;
  SystemTools::ConvertToUnixSlashes(fn);

  std::string::size_type slash_pos = fn.rfind('/');
  if (slash_pos == 0) {
    return "/";
  }
  if (slash_pos == 2 && fn[1] == ':') {
    // keep the / after a drive letter
    fn.resize(3);
    return fn;
  }
  if (slash_pos == std::string::npos) {
    return "";
  }
  fn.resize(slash_pos);
  return fn;
}